

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall tinyusdz::TypedTimeSamples<double>::update(TypedTimeSamples<double> *this)

{
  ::std::
  __sort<__gnu_cxx::__normal_iterator<tinyusdz::TypedTimeSamples<double>::Sample*,std::vector<tinyusdz::TypedTimeSamples<double>::Sample,std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>>>,__gnu_cxx::__ops::_Iter_comp_iter<tinyusdz::TypedTimeSamples<double>::update()const::_lambda(tinyusdz::TypedTimeSamples<double>::Sample_const&,tinyusdz::TypedTimeSamples<double>::Sample_const&)_1_>>
            ((this->_samples).
             super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->_samples).
             super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  this->_dirty = false;
  return;
}

Assistant:

void update() const {
    std::sort(_samples.begin(), _samples.end(),
              [](const Sample &a, const Sample &b) { return a.t < b.t; });

    _dirty = false;

    return;
  }